

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsCheckNameOfClass.cxx
# Opt level: O2

size_t __thiscall kws::Parser::GetClassPosition(Parser *this,size_t position,string *buffer)

{
  byte bVar1;
  char cVar2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  allocator local_71;
  string nameOfClass;
  string local_50;
  
  if (buffer->_M_string_length == 0) {
    std::__cxx11::string::_M_assign((string *)buffer);
  }
  uVar4 = std::__cxx11::string::find((char *)buffer,0x162916);
  std::__cxx11::string::string((string *)&nameOfClass,"",&local_71);
  while (uVar4 != 0xffffffffffffffff) {
    std::__cxx11::string::string((string *)&local_50,(string *)buffer);
    bVar3 = IsBetweenCharsFast(this,'<','>',uVar4,false,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    if (!bVar3) {
      uVar7 = 1;
      if (1 < uVar4) {
        bVar1 = (buffer->_M_dataplus)._M_p[uVar4 - 1];
        if (bVar1 < 0x30) {
          uVar7 = 0x800100000400 >> (bVar1 & 0x3f);
        }
        else {
          uVar7 = 0;
        }
      }
      if (((uVar4 < buffer->_M_string_length - 2) &&
          (cVar2 = (buffer->_M_dataplus)._M_p[uVar4 + 5], cVar2 != ' ')) && (cVar2 != '/')) {
        uVar7 = (ulong)(cVar2 == '\r' & (byte)uVar7);
      }
      uVar5 = std::__cxx11::string::find((char)buffer,0x7b);
      uVar6 = std::__cxx11::string::find((char)buffer,0x3b);
      if (uVar5 < uVar6) {
        for (uVar4 = uVar4 + 4;
            ((cVar2 = (buffer->_M_dataplus)._M_p[uVar4], cVar2 != '{' &&
             (uVar4 < buffer->_M_string_length)) && (cVar2 != ':')); uVar4 = uVar4 + 1) {
          if (cVar2 == ';') goto LAB_001444fd;
        }
        if ((uVar7 & 1) != 0) goto LAB_0014451d;
      }
    }
LAB_001444fd:
    uVar4 = std::__cxx11::string::find((char *)buffer,0x162916);
  }
  uVar4 = 0xffffffffffffffff;
LAB_0014451d:
  std::__cxx11::string::~string((string *)&nameOfClass);
  return uVar4;
}

Assistant:

size_t Parser::GetClassPosition(size_t position,std::string buffer) const
{
  if(position == std::string::npos)
   {
   position = 0;
   }

   if (buffer.empty()) {
     buffer = m_BufferNoComment;
   }

  size_t pos = buffer.find("class",position);

  std::string nameOfClass = "";
  while(pos!=std::string::npos)
    {
    if(!this->IsBetweenCharsFast('<','>',pos,false,buffer))
      {
      bool valid = true;      
      // We check that the word class is alone
      if(pos>1)
        {
        if(buffer[pos-1] != ' ' && buffer[pos-1] != '/' && buffer[pos-1] != '\n')
          {
          valid = false;
          }
        }
      if(pos<buffer.size()-2)
        {
        if(buffer[pos+5] != ' ' && buffer[pos+5] != '/' && buffer[pos+5] != '\r')
          {
          valid = false;
          } 
        }
      
      size_t i = pos+4;
      // We should get a { before a ;
      size_t brac = buffer.find('{',pos);
      size_t sem = buffer.find(';',pos);

      if(sem<=brac)
        {
        valid = false;
        }
      else
        {
        while((buffer[i] != '{')
          && (i<buffer.size())
          )
          {
          if(buffer[i] == ';')
            {
            valid = false;
            break;
            }
          else if(buffer[i] == ':')
            {
            break;
            }
          i++;
          }
        }
      
      if(valid)
        {
        return i;
        }
      }
    pos = buffer.find("class",pos+1);
    }

  return std::string::npos;
}